

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void __thiscall
fmt::v8::detail::fill_t<char>::operator=(fill_t<char> *this,basic_string_view<char> s)

{
  size_t i;
  ulong uVar1;
  
  if (4 < s.size_) {
    throw_format_error("invalid fill");
    return;
  }
  for (uVar1 = 0; s.size_ != uVar1; uVar1 = uVar1 + 1) {
    this->data_[uVar1] = s.data_[uVar1];
  }
  this->size_ = (uchar)s.size_;
  return;
}

Assistant:

FMT_CONSTEXPR void operator=(basic_string_view<Char> s) {
    auto size = s.size();
    if (size > max_size) return throw_format_error("invalid fill");
    for (size_t i = 0; i < size; ++i) data_[i] = s[i];
    size_ = static_cast<unsigned char>(size);
  }